

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

int __thiscall Fl_Input_::undo(Fl_Input_ *this)

{
  int n;
  int iVar1;
  Fl_When FVar2;
  char *pcVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  bool bVar5;
  uint local_28;
  uint local_24;
  int b1;
  int b;
  int xlen;
  int ilen;
  Fl_Input_ *this_local;
  
  n = undoinsert;
  iVar1 = undocut;
  was_up_down = 0;
  if ((undowidget == this) && ((undocut != 0 || (undoinsert != 0)))) {
    local_28 = undoat - undoinsert;
    put_in_buffer(this,this->size_ + undocut);
    local_24 = local_28;
    if (iVar1 != 0) {
      memmove(this->buffer + (long)iVar1 + (long)(int)local_28,this->buffer + (int)local_28,
              (long)(int)((this->size_ - local_28) + 1));
      memcpy(this->buffer + (int)local_28,undobuffer,(long)iVar1);
      this->size_ = iVar1 + this->size_;
      local_24 = iVar1 + local_28;
    }
    if (n != 0) {
      undobuffersize(n);
      memcpy(undobuffer,this->buffer + (int)local_24,(long)n);
      memmove(this->buffer + (int)local_24,this->buffer + (long)n + (long)(int)local_24,
              (long)(int)(((this->size_ - n) - local_24) + 1));
      this->size_ = this->size_ - n;
    }
    undocut = n;
    if (n != 0) {
      yankcut = n;
    }
    undoinsert = iVar1;
    undoat = local_24;
    this->mark_ = local_24;
    this->position_ = local_24;
    iVar1 = wrap(this);
    uVar4 = extraout_RDX;
    if (iVar1 != 0) {
      while( true ) {
        bVar5 = false;
        if (0 < (int)local_28) {
          pcVar3 = index(this,(char *)(ulong)local_28,(int)uVar4);
          bVar5 = (int)pcVar3 != 10;
          uVar4 = extraout_RDX_00;
        }
        if (!bVar5) break;
        local_28 = local_28 - 1;
      }
    }
    minimal_update(this,local_28);
    Fl_Widget::set_changed(&this->super_Fl_Widget);
    FVar2 = Fl_Widget::when(&this->super_Fl_Widget);
    if ((FVar2 & FL_WHEN_CHANGED) != FL_WHEN_NEVER) {
      Fl_Widget::do_callback(&this->super_Fl_Widget);
    }
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Input_::undo() {
  was_up_down = 0;
  if ( undowidget != this || (!undocut && !undoinsert) ) return 0;

  int ilen = undocut;
  int xlen = undoinsert;
  int b = undoat-xlen;
  int b1 = b;

  put_in_buffer(size_+ilen);

  if (ilen) {
    memmove(buffer+b+ilen, buffer+b, size_-b+1);
    memcpy(buffer+b, undobuffer, ilen);
    size_ += ilen;
    b += ilen;
  }

  if (xlen) {
    undobuffersize(xlen);
    memcpy(undobuffer, buffer+b, xlen);
    memmove(buffer+b, buffer+b+xlen, size_-xlen-b+1);
    size_ -= xlen;
  }

  undocut = xlen;
  if (xlen) yankcut = xlen;
  undoinsert = ilen;
  undoat = b;
  mark_ = b /* -ilen */;
  position_ = b;

  if (wrap())
    while (b1 > 0 && index(b1)!='\n') b1--;
  minimal_update(b1);
  set_changed();
  if (when()&FL_WHEN_CHANGED) do_callback();
  return 1;
}